

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O1

void __thiscall Js::ScriptContext::~ScriptContext(ScriptContext *this)

{
  PSCRIPTCONTEXT_HANDLE *scriptContextInfoAddress;
  uint *puVar1;
  Recycler *pRVar2;
  JavascriptLibrary *pJVar3;
  GlobalObject *obj;
  DebugContext *this_00;
  code *pcVar4;
  bool bVar5;
  HRESULT HVar6;
  undefined4 *puVar7;
  size_t sizeCat;
  CriticalSection *this_01;
  
  (this->super_ScriptContextInfo)._vptr_ScriptContextInfo = (_func_int **)&PTR_GetNullAddr_014f0bb0;
  this_01 = &this->threadContext->csFunctionBody;
  CCLock::Enter(&this_01->super_CCLock);
  if (this->hostScriptContext != (HostScriptContext *)0x0) {
    (**this->hostScriptContext->_vptr_HostScriptContext)();
    this->ensureParentInfo = false;
  }
  if (this->hasProtoOrStoreFieldInlineCache == true) {
    ThreadContext::ClearInlineCaches(this->threadContext);
    ClearInlineCaches(this);
    if (this->hasProtoOrStoreFieldInlineCache == true) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                  ,0x1b8,"(!this->hasProtoOrStoreFieldInlineCache)",
                                  "!this->hasProtoOrStoreFieldInlineCache");
      if (!bVar5) goto LAB_0078f9b2;
      *puVar7 = 0;
    }
  }
  if (this->hasIsInstInlineCache == true) {
    ThreadContext::ClearIsInstInlineCaches(this->threadContext);
    ClearIsInstInlineCaches(this);
    if (this->hasIsInstInlineCache == true) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                  ,0x1c0,"(!this->hasIsInstInlineCache)",
                                  "!this->hasIsInstInlineCache");
      if (!bVar5) goto LAB_0078f9b2;
      *puVar7 = 0;
    }
  }
  if (((this->super_ScriptContextBase).isClosed == true) &&
     (this->isScriptContextActuallyClosed == false)) {
    ThreadContext::RemoveFromPendingClose(this->threadContext,this);
  }
  SetIsClosed(this);
  bVar5 = Close(this,true);
  pRVar2 = (this->numberAllocator).recycler;
  sizeCat = 0x10;
  if (pRVar2->verifyEnabled != false) {
    sizeCat = (ulong)pRVar2->verifyPad + 0x1f & 0xfffffffffffffff0;
  }
  Memory::HeapInfo::
  RemoveSmallAllocator<Memory::SmallHeapBlockAllocator<Memory::SmallLeafHeapBlockT<SmallAllocationBlockAttributes>>>
            (&(pRVar2->autoHeap).defaultHeap,&(this->numberAllocator).allocator,sizeCat);
  (this->numberAllocator).recycler = (Recycler *)0x0;
  ShutdownClearSourceLists(this);
  if (this->regexStacks != (RegexStacks *)0x0) {
    Memory::
    DeleteObject<Memory::ArenaAllocator,(Memory::AllocatorDeleteFlags)0,UnifiedRegex::RegexStacks>
              (&this->regexAllocator,this->regexStacks);
    this->regexStacks = (RegexStacks *)0x0;
  }
  pJVar3 = (this->super_ScriptContextBase).javascriptLibrary;
  if (pJVar3 != (JavascriptLibrary *)0x0) {
    (pJVar3->super_JavascriptLibraryBase).scriptContext.ptr = (ScriptContext *)0x0;
    if (bVar5) {
      if (this->nativeCodeGen != (NativeCodeGenerator *)0x0) {
        bVar5 = IsClosedNativeCodeGenerator(this->nativeCodeGen);
        if (!bVar5) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar7 = 1;
          bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                      ,0x1e3,"(this->IsClosedNativeCodeGenerator())",
                                      "this->IsClosedNativeCodeGenerator()");
          if (!bVar5) goto LAB_0078f9b2;
          *puVar7 = 0;
        }
      }
      obj = (this->super_ScriptContextBase).globalObject;
      if (((obj != (GlobalObject *)0x0) && (this->threadContext->isThreadBound == true)) &&
         ((((this->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
          chakraEngine.ptr == (ChakraEngine *)0x0)) {
        Memory::Recycler::RootRelease(this->recycler,obj,(uint *)0x0);
      }
    }
    (this->super_ScriptContextBase).javascriptLibrary = (JavascriptLibrary *)0x0;
  }
  if ((this->prev != (ScriptContext *)0x0 || this->next != (ScriptContext *)0x0) ||
     (this->threadContext->scriptContextList == this)) {
    ThreadContext::UnregisterScriptContext(this->threadContext,this);
  }
  if (this->backgroundParser != (BackgroundParser *)0x0) {
    BackgroundParser::Delete(this->backgroundParser);
    this->backgroundParser = (BackgroundParser *)0x0;
  }
  if (this->debugContext != (DebugContext *)0x0) {
    if ((this->debugContext->field_0x1c & 1) == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                  ,0x200,"(this->debugContext->IsClosed())",
                                  "this->debugContext->IsClosed()");
      if (!bVar5) goto LAB_0078f9b2;
      *puVar7 = 0;
    }
    this_00 = this->debugContext;
    DebugContext::~DebugContext(this_00);
    Memory::HeapAllocator::Free(&Memory::HeapAllocator::Instance,this_00,0x20);
    this->debugContext = (DebugContext *)0x0;
  }
  if (this->nativeCodeGen != (NativeCodeGenerator *)0x0) {
    DeleteNativeCodeGenerator(this->nativeCodeGen);
    this->nativeCodeGen = (NativeCodeGenerator *)0x0;
  }
  if (this->jitFuncRangeCache != (JITPageAddrToFuncRangeCache *)0x0) {
    Memory::
    DeleteObject<Memory::HeapAllocator,(Memory::AllocatorDeleteFlags)0,Js::JITPageAddrToFuncRangeCache>
              (&Memory::HeapAllocator::Instance,this->jitFuncRangeCache);
    this->jitFuncRangeCache = (JITPageAddrToFuncRangeCache *)0x0;
  }
  if (this->interpreterThunkEmitter != (InterpreterThunkEmitter *)0x0) {
    Memory::
    DeleteObject<Memory::HeapAllocator,(Memory::AllocatorDeleteFlags)0,InterpreterThunkEmitter>
              (&Memory::HeapAllocator::Instance,this->interpreterThunkEmitter);
    this->interpreterThunkEmitter = (InterpreterThunkEmitter *)0x0;
  }
  if (this->asmJsInterpreterThunkEmitter != (InterpreterThunkEmitter *)0x0) {
    Memory::
    DeleteObject<Memory::HeapAllocator,(Memory::AllocatorDeleteFlags)0,InterpreterThunkEmitter>
              (&Memory::HeapAllocator::Instance,this->asmJsInterpreterThunkEmitter);
    this->asmJsInterpreterThunkEmitter = (InterpreterThunkEmitter *)0x0;
  }
  if (this->asmJsCodeGenerator != (AsmJsCodeGenerator *)0x0) {
    Memory::HeapAllocator::Free(&Memory::HeapAllocator::Instance,this->asmJsCodeGenerator,0x90);
    this->asmJsCodeGenerator = (AsmJsCodeGenerator *)0x0;
  }
  (this->weakReferenceDictionaryList).super_SListNodeBase<Memory::ArenaAllocator>.next =
       &(this->weakReferenceDictionaryList).super_SListNodeBase<Memory::ArenaAllocator>;
  (this->weakReferenceDictionaryList).super_RealCount.count = 0;
  if (this->m_remoteScriptContextAddr != (PSCRIPTCONTEXT_HANDLE)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                ,0x22f,"(JITManager::GetJITManager()->IsOOPJITEnabled())",
                                "JITManager::GetJITManager()->IsOOPJITEnabled()");
    if (!bVar5) goto LAB_0078f9b2;
    scriptContextInfoAddress = &this->m_remoteScriptContextAddr;
    *puVar7 = 0;
    HVar6 = JITManager::CleanupScriptContext
                      ((JITManager *)&JITManager::s_jitManager,scriptContextInfoAddress);
    if ((HVar6 == 0) && (*scriptContextInfoAddress != (PSCRIPTCONTEXT_HANDLE)0x0)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                  ,0x232,"(m_remoteScriptContextAddr == nullptr)",
                                  "m_remoteScriptContextAddr == nullptr");
      if (!bVar5) goto LAB_0078f9b2;
      *puVar7 = 0;
    }
    *scriptContextInfoAddress = (PSCRIPTCONTEXT_HANDLE)0x0;
  }
  if (this->isScriptContextActuallyClosed == false) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                ,0x238,"(this->IsActuallyClosed())","this->IsActuallyClosed()");
    if (!bVar5) {
LAB_0078f9b2:
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar7 = 0;
  }
  puVar1 = &this->threadContext->closedScriptContextCount;
  *puVar1 = *puVar1 - 1;
  CCLock::Leave(&this_01->super_CCLock);
  SListBase<JsUtil::IWeakReferenceDictionary_*,_Memory::ArenaAllocator,_RealCount>::~SListBase
            (&this->weakReferenceDictionaryList);
  CCLock::~CCLock(&(this->debugContextCloseCS).super_CCLock);
  Memory::
  RecyclerRootPtr<JsUtil::List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::FreeListedRemovePolicy,_DefaultComparer>_>
  ::~RecyclerRootPtr(&this->sourceList);
  JsUtil::
  BaseDictionary<void_*,_void_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  ::~BaseDictionary(&(this->bindRef).
                     super_BaseDictionary<void_*,_void_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                   );
  Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::~ArenaAllocatorBase
            (&(this->miscAllocator).
              super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>);
  Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::~ArenaAllocatorBase
            (&(this->regexAllocator).
              super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>);
  Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::~ArenaAllocatorBase
            (&(this->sourceCodeAllocator).
              super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>);
  Memory::CacheAllocator::~CacheAllocator(&this->enumeratorCacheAllocator);
  Memory::CacheAllocator::~CacheAllocator(&this->isInstInlineCacheAllocator);
  Memory::InlineCacheAllocator::~InlineCacheAllocator(&this->inlineCacheAllocator);
  Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::~ArenaAllocatorBase
            (&(this->dynamicProfileInfoAllocator).
              super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>);
  Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::~ArenaAllocatorBase
            (&(this->generalAllocator).
              super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>);
  Memory::
  RecyclerRootPtr<JsUtil::List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::WeakRefFreeListedRemovePolicy,_DefaultComparer>_>
  ::~RecyclerRootPtr(&this->calleeUtf8SourceInfoList);
  ScriptContextOptimizationOverrideInfo::~ScriptContextOptimizationOverrideInfo
            (&this->optimizationOverrides);
  return;
}

Assistant:

ScriptContext::~ScriptContext()
    {
        // Take etw rundown lock on this thread context. We are going to change/destroy this scriptContext.
        AutoCriticalSection autocs(GetThreadContext()->GetFunctionBodyLock());

        // TODO: Can we move this on Close()?
        ClearHostScriptContext();

        if (this->hasProtoOrStoreFieldInlineCache)
        {
            // TODO (PersistentInlineCaches): It really isn't necessary to clear inline caches in all script contexts.
            // Since this script context is being destroyed, the inline cache arena will also go away and release its
            // memory back to the page allocator.  Thus, we cannot leave this script context's inline caches on the
            // thread context's invalidation lists.  However, it should suffice to remove this script context's caches
            // without touching other script contexts' caches.  We could call some form of RemoveInlineCachesFromInvalidationLists()
            // on the inline cache allocator, which would walk all inline caches and zap values pointed to by strongRef.

            // clear out all inline caches to remove our proto inline caches from the thread context
            threadContext->ClearInlineCaches();

            ClearInlineCaches();
            Assert(!this->hasProtoOrStoreFieldInlineCache);
        }

        if (this->hasIsInstInlineCache)
        {
            // clear out all inline caches to remove our proto inline caches from the thread context
            threadContext->ClearIsInstInlineCaches();
            ClearIsInstInlineCaches();
            Assert(!this->hasIsInstInlineCache);
        }

        // Only call RemoveFromPendingClose if we are in a pending close state.
        if (isClosed && !isScriptContextActuallyClosed)
        {
            threadContext->RemoveFromPendingClose(this);
        }

        SetIsClosed();
        bool closed = Close(true);

        // JIT may access number allocator. Need to close the script context first,
        // which will close the native code generator and abort any current job on this generator.
        numberAllocator.Uninitialize();

        ShutdownClearSourceLists();

        if (regexStacks)
        {
            Adelete(RegexAllocator(), regexStacks);
            regexStacks = nullptr;
        }

        if (javascriptLibrary != nullptr)
        {
            javascriptLibrary->scriptContext = nullptr;

            if (closed)
            {
                // if we just closed, we haven't unpin the object yet.
                // We need to null out the script context in the global object first
                // before we unpin the global object so that script context dtor doesn't get called twice

#if ENABLE_NATIVE_CODEGEN
                Assert(this->IsClosedNativeCodeGenerator());
#endif
                if (globalObject && !GetThreadContext()->IsJSRT() && !GetLibrary()->IsChakraEngine())
                {
                    this->recycler->RootRelease(globalObject);
                }
            }

            javascriptLibrary = nullptr;
        }

        // Normally the JavascriptLibraryBase will unregister the scriptContext from the threadContext.
        // In cases where we don't finish initialization e.g. OOM, manually unregister the scriptContext.
        if (this->IsRegistered())
        {
            threadContext->UnregisterScriptContext(this);
        }

#if ENABLE_BACKGROUND_PARSING
        if (this->backgroundParser != nullptr)
        {
            BackgroundParser::Delete(this->backgroundParser);
            this->backgroundParser = nullptr;
        }
#endif

#ifdef ENABLE_SCRIPT_DEBUGGING
        if (this->debugContext != nullptr)
        {
            Assert(this->debugContext->IsClosed());
            HeapDelete(this->debugContext);
            this->debugContext = nullptr;
        }
#endif

#if ENABLE_NATIVE_CODEGEN
        if (this->nativeCodeGen != nullptr)
        {
            DeleteNativeCodeGenerator(this->nativeCodeGen);
            nativeCodeGen = NULL;
        }
        if (jitFuncRangeCache != nullptr)
        {
            HeapDelete(jitFuncRangeCache);
            jitFuncRangeCache = nullptr;
        }
#endif

#if DYNAMIC_INTERPRETER_THUNK
        if (this->interpreterThunkEmitter != nullptr)
        {
            HeapDelete(interpreterThunkEmitter);
            this->interpreterThunkEmitter = NULL;
        }
#endif

#ifdef ASMJS_PLAT
        if (this->asmJsInterpreterThunkEmitter != nullptr)
        {
            HeapDelete(asmJsInterpreterThunkEmitter);
            this->asmJsInterpreterThunkEmitter = nullptr;
        }

        if (this->asmJsCodeGenerator != nullptr)
        {
            HeapDelete(asmJsCodeGenerator);
            this->asmJsCodeGenerator = NULL;
        }
#endif

        // In case there is something added to the list between close and dtor, just reset the list again
        this->weakReferenceDictionaryList.Reset();

#if ENABLE_NATIVE_CODEGEN
        if (m_remoteScriptContextAddr)
        {
            Assert(JITManager::GetJITManager()->IsOOPJITEnabled());
            if (JITManager::GetJITManager()->CleanupScriptContext(&m_remoteScriptContextAddr) == S_OK)
            {
                Assert(m_remoteScriptContextAddr == nullptr);
            }
            m_remoteScriptContextAddr = nullptr;
        }
#endif

        Assert(this->IsActuallyClosed());
        this->GetThreadContext()->closedScriptContextCount--;

        PERF_COUNTER_DEC(Basic, ScriptContext);
    }